

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_AddTxInOut_Test::TestBody(TransactionContext_AddTxInOut_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  char *pcVar8;
  size_type sVar9;
  char *in_R9;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_;
  uint32_t index;
  AssertionResult gtest_ar_2;
  Address out1_addr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  OutPoint outpoint;
  Address script_addr;
  Script locking_script;
  Address addr;
  TransactionContext txc;
  bool *in_stack_fffffffffffff478;
  undefined7 in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff487;
  unsigned_long *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  char *in_stack_fffffffffffff498;
  OutPoint *in_stack_fffffffffffff4b8;
  undefined6 in_stack_fffffffffffff4c0;
  undefined1 in_stack_fffffffffffff4c6;
  undefined1 in_stack_fffffffffffff4c7;
  Address *in_stack_fffffffffffff4c8;
  undefined7 in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4d7;
  uint32_t *in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e4;
  TransactionContext *in_stack_fffffffffffff4e8;
  undefined5 in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff4f5;
  undefined1 in_stack_fffffffffffff4f6;
  undefined1 in_stack_fffffffffffff4f7;
  Address *in_stack_fffffffffffff4f8;
  undefined5 in_stack_fffffffffffff500;
  undefined1 in_stack_fffffffffffff505;
  undefined1 in_stack_fffffffffffff506;
  undefined1 in_stack_fffffffffffff507;
  TransactionContext *in_stack_fffffffffffff508;
  undefined5 in_stack_fffffffffffff510;
  TransactionContext *in_stack_fffffffffffff518;
  NetType in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff534;
  uint32_t index_00;
  TransactionContext *in_stack_fffffffffffff538;
  AssertHelper local_a98;
  Message local_a90;
  undefined4 local_a84;
  AssertionResult local_a80;
  AssertHelper local_a70;
  Message local_a68;
  undefined4 local_a5c;
  AssertionResult local_a58;
  AssertHelper local_a48;
  Message local_a40;
  undefined4 local_a34;
  AssertionResult local_a30;
  AssertHelper local_a20;
  Message local_a18;
  undefined4 local_a0c;
  size_type local_a08;
  AssertionResult local_a00;
  AssertHelper local_9f0;
  Message local_9e8;
  undefined4 local_9dc;
  AssertionResult local_9d8;
  string local_9c8;
  AssertHelper local_9a8;
  Message local_9a0;
  undefined1 local_991;
  AssertionResult local_990;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_980;
  Amount local_968;
  Amount local_958;
  Amount local_948;
  AssertHelper local_938;
  Message local_930;
  undefined4 local_928;
  uint32_t local_924;
  AssertionResult local_920;
  AssertHelper local_910;
  Message local_908;
  undefined4 local_8fc;
  AssertionResult local_8f8;
  string local_8e8;
  AssertHelper local_8c8;
  Message local_8c0;
  Script local_8b8;
  undefined1 local_879;
  AssertionResult local_878;
  AssertHelper local_868;
  Message local_860;
  undefined4 local_854;
  AssertionResult local_850;
  string local_840;
  AssertHelper local_820;
  Message local_818;
  undefined1 local_809;
  AssertionResult local_808;
  AssertHelper local_7f8;
  Message local_7f0;
  undefined4 local_7e4;
  AssertionResult local_7e0;
  string local_7d0;
  AssertHelper local_7b0;
  Message local_7a8;
  undefined1 local_799;
  AssertionResult local_798;
  undefined4 local_784;
  AssertHelper local_780;
  Message local_778;
  string local_770;
  AssertionResult local_750;
  Address local_740;
  AssertHelper local_5c8;
  Message local_5c0;
  string local_5b8;
  AssertionResult local_598;
  AssertHelper local_588;
  Message local_580;
  string local_578;
  AssertionResult local_558;
  Amount local_548;
  Amount local_538;
  allocator local_521;
  string local_520;
  Txid local_500;
  OutPoint local_4e0;
  allocator local_4b1;
  string local_4b0;
  Txid local_490;
  OutPoint local_470;
  Address local_448;
  allocator local_2c9;
  string local_2c8;
  Script local_2a8;
  allocator local_259;
  string local_258;
  Address local_238;
  AbstractTransaction local_c0 [12];
  
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
             (uint32_t)((ulong)in_stack_fffffffffffff478 >> 0x20),
             (uint32_t)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",&local_259)
  ;
  cfd::core::Address::Address(&local_238,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c8,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c",&local_2c9);
  cfd::core::Script::Script(&local_2a8,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  cfd::core::Address::Address(&local_448,kCfdSuccess,&local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b0,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_4b1);
  cfd::core::Txid::Txid(&local_490,&local_4b0);
  cfd::core::OutPoint::OutPoint(&local_470,&local_490,2);
  cfd::core::Txid::~Txid((Txid *)0x23d5e7);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_520,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_521);
  cfd::core::Txid::Txid(&local_500,&local_520);
  cfd::core::OutPoint::OutPoint(&local_4e0,&local_500,0);
  cfd::TransactionContext::AddTxIn
            ((TransactionContext *)
             CONCAT17(in_stack_fffffffffffff4c7,
                      CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)),
             in_stack_fffffffffffff4b8);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x23d688);
  cfd::core::Txid::~Txid((Txid *)0x23d695);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  cfd::TransactionContext::AddTxIn
            ((TransactionContext *)
             CONCAT17(in_stack_fffffffffffff4c7,
                      CONCAT16(in_stack_fffffffffffff4c6,in_stack_fffffffffffff4c0)),
             in_stack_fffffffffffff4b8);
  cfd::core::Amount::Amount(&local_538,100000000000000);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_fffffffffffff507,
                      CONCAT16(in_stack_fffffffffffff506,
                               CONCAT15(in_stack_fffffffffffff505,in_stack_fffffffffffff500))),
             in_stack_fffffffffffff4f8,
             (Amount *)
             CONCAT17(in_stack_fffffffffffff4f7,
                      CONCAT16(in_stack_fffffffffffff4f6,
                               CONCAT15(in_stack_fffffffffffff4f5,in_stack_fffffffffffff4f0))));
  cfd::core::Amount::Amount(&local_548,0x640b2351f97c);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_fffffffffffff507,
                      CONCAT16(in_stack_fffffffffffff506,
                               CONCAT15(in_stack_fffffffffffff505,in_stack_fffffffffffff500))),
             in_stack_fffffffffffff4f8,
             (Amount *)
             CONCAT17(in_stack_fffffffffffff4f7,
                      CONCAT16(in_stack_fffffffffffff4f6,
                               CONCAT15(in_stack_fffffffffffff4f5,in_stack_fffffffffffff4f0))));
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_578,local_c0);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_558,"txc.GetHex().c_str()",
             "\"0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000\""
             ,pcVar8,
             "0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000"
            );
  std::__cxx11::string::~string((string *)&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_558);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    in_stack_fffffffffffff538 =
         (TransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x23d9d3);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x59,(char *)in_stack_fffffffffffff538);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message((Message *)0x23da36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23da8e);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_5b8,&local_238);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_598,"addr.GetAddress().c_str()",
             "\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",pcVar8,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  std::__cxx11::string::~string((string *)&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_598);
  index_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff534);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x23db7b);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x5a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    testing::Message::~Message((Message *)0x23dbde);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23dc36);
  cfd::TransactionContext::GetTxOutAddress
            (in_stack_fffffffffffff538,index_00,in_stack_fffffffffffff530);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_770,&local_740);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_750,"out1_addr.GetAddress().c_str()",
             "\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",pcVar8,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  std::__cxx11::string::~string((string *)&local_770);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_750);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    in_stack_fffffffffffff518 =
         (TransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x23dd5a);
    testing::internal::AssertHelper::AssertHelper
              (&local_780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x5d,(char *)in_stack_fffffffffffff518);
    testing::internal::AssertHelper::operator=(&local_780,&local_778);
    testing::internal::AssertHelper::~AssertHelper(&local_780);
    testing::Message::~Message((Message *)0x23ddbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23de15);
  local_784 = 0;
  uVar2 = cfd::TransactionContext::IsFindTxIn
                    (in_stack_fffffffffffff4e8,
                     (OutPoint *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                     in_stack_fffffffffffff4d8);
  local_799 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
             in_stack_fffffffffffff478,(type *)0x23de6f);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_798);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7d0,(internal *)&local_798,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x60,pcVar8);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    std::__cxx11::string::~string((string *)&local_7d0);
    testing::Message::~Message((Message *)0x23df6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23dfe5);
  local_7e4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (uint *)in_stack_fffffffffffff488,
             (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_7e0);
  if (!(bool)uVar4) {
    testing::Message::Message(&local_7f0);
    in_stack_fffffffffffff508 =
         (TransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x23e08c);
    testing::internal::AssertHelper::AssertHelper
              (&local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x61,(char *)in_stack_fffffffffffff508);
    testing::internal::AssertHelper::operator=(&local_7f8,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper(&local_7f8);
    testing::Message::~Message((Message *)0x23e0ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23e147);
  uVar5 = cfd::TransactionContext::IsFindTxOut
                    (in_stack_fffffffffffff508,
                     (Address *)
                     CONCAT17(in_stack_fffffffffffff507,
                              CONCAT16(in_stack_fffffffffffff506,
                                       CONCAT15(in_stack_fffffffffffff505,in_stack_fffffffffffff500)
                                      )),(uint32_t *)in_stack_fffffffffffff4f8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT17(in_stack_fffffffffffff4f7,
                              CONCAT16(in_stack_fffffffffffff4f6,
                                       CONCAT15(in_stack_fffffffffffff4f5,in_stack_fffffffffffff4f0)
                                      )));
  local_809 = uVar5;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
             in_stack_fffffffffffff478,(type *)0x23e19a);
  uVar6 = testing::AssertionResult::operator_cast_to_bool(&local_808);
  if (!(bool)uVar6) {
    testing::Message::Message(&local_818);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_840,(internal *)&local_808,(AssertionResult *)"txc.IsFindTxOut(addr, &index)",
               "false","true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x62,pcVar8);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    testing::Message::~Message((Message *)0x23e298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23e310);
  local_854 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (uint *)in_stack_fffffffffffff488,
             (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_850);
  if (!(bool)uVar7) {
    testing::Message::Message(&local_860);
    in_stack_fffffffffffff4f8 =
         (Address *)testing::AssertionResult::failure_message((AssertionResult *)0x23e3b7);
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,99,(char *)in_stack_fffffffffffff4f8);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    testing::Message::~Message((Message *)0x23e41a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23e472);
  cfd::core::Address::GetLockingScript(&local_8b8,&local_448);
  uVar2 = cfd::TransactionContext::IsFindTxOut
                    (in_stack_fffffffffffff518,
                     (Script *)
                     CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffff510))),
                     (uint32_t *)in_stack_fffffffffffff508,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,in_stack_fffffffffffff500))));
  local_879 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
             in_stack_fffffffffffff478,(type *)0x23e4d6);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_878);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_8c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8e8,(internal *)&local_878,
               (AssertionResult *)"txc.IsFindTxOut(script_addr.GetLockingScript(), &index)","false",
               "true",in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,100,pcVar8);
    testing::internal::AssertHelper::operator=(&local_8c8,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper(&local_8c8);
    std::__cxx11::string::~string((string *)&local_8e8);
    testing::Message::~Message((Message *)0x23e601);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23e679);
  local_8fc = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (uint *)in_stack_fffffffffffff488,
             (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_8f8);
  if (!(bool)uVar4) {
    testing::Message::Message(&local_908);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x23e71a);
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x65,pcVar8);
    testing::internal::AssertHelper::operator=(&local_910,&local_908);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    testing::Message::~Message((Message *)0x23e777);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23e7cf);
  local_924 = cfd::TransactionContext::GetTxOutIndex
                        ((TransactionContext *)
                         CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
                         in_stack_fffffffffffff4c8);
  local_928 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (uint *)in_stack_fffffffffffff488,
             (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_920);
  if (!bVar1) {
    testing::Message::Message(&local_930);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x23e896);
    testing::internal::AssertHelper::AssertHelper
              (&local_938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x66,pcVar8);
    testing::internal::AssertHelper::operator=(&local_938,&local_930);
    testing::internal::AssertHelper::~AssertHelper(&local_938);
    testing::Message::~Message((Message *)0x23e8f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23e94b);
  cfd::core::Amount::Amount(&local_948,100000000000000);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,in_stack_fffffffffffff500))),
             in_stack_fffffffffffff4f8,
             (Amount *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffff4f0))));
  cfd::core::Amount::Amount(&local_958,0x640b2351f97c);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,in_stack_fffffffffffff500))),
             in_stack_fffffffffffff4f8,
             (Amount *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffff4f0))));
  cfd::core::Amount::Amount(&local_968,100000000000000);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,in_stack_fffffffffffff500))),
             in_stack_fffffffffffff4f8,
             (Amount *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffff4f0))));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x23ea05);
  local_991 = cfd::TransactionContext::IsFindTxOut
                        (in_stack_fffffffffffff508,
                         (Address *)
                         CONCAT17(uVar5,CONCAT16(uVar6,CONCAT15(uVar7,in_stack_fffffffffffff500))),
                         (uint32_t *)in_stack_fffffffffffff4f8,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_fffffffffffff4f0))));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
             in_stack_fffffffffffff478,(type *)0x23ea53);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9c8,(internal *)&local_990,
               (AssertionResult *)"txc.IsFindTxOut(script_addr, &index, &indexes)","false","true",
               in_R9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    std::__cxx11::string::~string((string *)&local_9c8);
    testing::Message::~Message((Message *)0x23eb64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23ebdc);
  local_9dc = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (uint *)in_stack_fffffffffffff488,
             (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9d8);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x23ec7d);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6d,pcVar8);
    testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper(&local_9f0);
    testing::Message::~Message((Message *)0x23ecda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23ed2f);
  local_a08 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_980);
  local_a0c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff498,
             (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488,
             (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a00);
  if (!bVar1) {
    testing::Message::Message(&local_a18);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x23ede5);
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x6e,pcVar8);
    testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    testing::Message::~Message((Message *)0x23ee42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x23ee9a);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_980);
  if (sVar9 == 3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_980,0);
    local_a34 = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (uint *)in_stack_fffffffffffff488,
               (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a30);
    if (!bVar1) {
      testing::Message::Message(&local_a40);
      in_stack_fffffffffffff498 =
           testing::AssertionResult::failure_message((AssertionResult *)0x23ef5e);
      testing::internal::AssertHelper::AssertHelper
                (&local_a48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x70,in_stack_fffffffffffff498);
      testing::internal::AssertHelper::operator=(&local_a48,&local_a40);
      testing::internal::AssertHelper::~AssertHelper(&local_a48);
      testing::Message::~Message((Message *)0x23efbb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x23f010);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_980,1);
    local_a5c = 2;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (uint *)in_stack_fffffffffffff488,
               (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
    in_stack_fffffffffffff497 = testing::AssertionResult::operator_cast_to_bool(&local_a58);
    if (!(bool)in_stack_fffffffffffff497) {
      testing::Message::Message(&local_a68);
      in_stack_fffffffffffff488 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0x23f0be);
      testing::internal::AssertHelper::AssertHelper
                (&local_a70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x71,(char *)in_stack_fffffffffffff488);
      testing::internal::AssertHelper::operator=(&local_a70,&local_a68);
      testing::internal::AssertHelper::~AssertHelper(&local_a70);
      testing::Message::~Message((Message *)0x23f11b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x23f170);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_980,2);
    local_a84 = 4;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff498,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (uint *)in_stack_fffffffffffff488,
               (int *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
    in_stack_fffffffffffff487 = testing::AssertionResult::operator_cast_to_bool(&local_a80);
    if (!(bool)in_stack_fffffffffffff487) {
      testing::Message::Message(&local_a90);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x23f21e);
      testing::internal::AssertHelper::AssertHelper
                (&local_a98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x72,pcVar8);
      testing::internal::AssertHelper::operator=(&local_a98,&local_a90);
      testing::internal::AssertHelper::~AssertHelper(&local_a98);
      testing::Message::~Message((Message *)0x23f279);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x23f2ce);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x23f306);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  cfd::TransactionContext::~TransactionContext
            ((TransactionContext *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  return;
}

Assistant:

TEST(TransactionContext, AddTxInOut)
{
  TransactionContext txc(2, 0);
  Address addr("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");
  Script locking_script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  Address script_addr(NetType::kMainnet, locking_script);
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  txc.AddTxOut(addr, Amount(int64_t{109998999992700}));

  EXPECT_STREQ(txc.GetHex().c_str(), "0200000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff0200407a10f35a000017a91419970f64fb36fe3b7b21eca335ff70dde51eb8c8877cf951230b6400001976a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kMainnet);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(script_addr.GetLockingScript(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);

  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  txc.AddTxOut(addr, Amount(int64_t{109998999992700}));
  txc.AddTxOut(script_addr, Amount(int64_t{100000000000000}));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(script_addr, &index, &indexes));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(indexes.size(), 3);
  if (indexes.size() == 3) {
    EXPECT_EQ(indexes[0], 0);
    EXPECT_EQ(indexes[1], 2);
    EXPECT_EQ(indexes[2], 4);
  }
}